

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,REF_CLOUD *one_layer,REF_NODE ref_node)

{
  REF_DBL *pRVar1;
  uint uVar2;
  REF_CLOUD pRVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  REF_GLOB RVar7;
  REF_STATUS ref_private_macro_code_rss;
  long lVar8;
  REF_INT local_pivot;
  REF_CLOUD copy;
  REF_DBL xyzs [4];
  int local_74;
  REF_CLOUD local_70;
  REF_NODE local_68;
  long local_60;
  REF_DBL local_58 [5];
  
  uVar2 = ref_cloud_deep_copy(&local_70,ref_cloud);
  if (uVar2 == 0) {
    if (local_70->n < 1) {
      RVar7 = -1;
    }
    else {
      RVar7 = *local_70->global;
    }
    if (0 < local_70->n) {
      lVar6 = 0;
      local_68 = ref_node;
      do {
        local_60 = lVar6;
        uVar2 = ref_node_local(local_68,RVar7,&local_74);
        if (uVar2 == 5) {
          printf("global %ld not found\n",RVar7);
        }
        else {
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x3ad,"ref_recon_grow_cloud_one_layer",(ulong)uVar2,"local search");
            return uVar2;
          }
          if (one_layer[local_74]->n < 1) {
            RVar7 = -1;
          }
          else {
            RVar7 = *one_layer[local_74]->global;
          }
          pRVar3 = one_layer[local_74];
          if (0 < pRVar3->n) {
            lVar6 = 0;
            lVar8 = 0;
            do {
              lVar5 = (long)pRVar3->naux;
              if (0 < lVar5) {
                pRVar1 = pRVar3->aux;
                lVar4 = 0;
                do {
                  local_58[lVar4] = *(REF_DBL *)((long)pRVar1 + lVar4 * 8 + lVar6 * lVar5);
                  lVar4 = lVar4 + 1;
                } while (lVar5 != lVar4);
              }
              uVar2 = ref_cloud_store(ref_cloud,RVar7,local_58);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x3b3,"ref_recon_grow_cloud_one_layer",(ulong)uVar2,"store stencil increase"
                      );
                return uVar2;
              }
              lVar8 = lVar8 + 1;
              RVar7 = -1;
              if (lVar8 < one_layer[local_74]->n) {
                RVar7 = one_layer[local_74]->global[lVar8];
              }
              pRVar3 = one_layer[local_74];
              lVar6 = lVar6 + 8;
            } while (lVar8 < pRVar3->n);
          }
        }
        lVar6 = local_60 + 1;
        RVar7 = -1;
        if (lVar6 < local_70->n) {
          RVar7 = local_70->global[lVar6];
        }
      } while (lVar6 < local_70->n);
    }
    ref_cloud_free(local_70);
    uVar2 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3a6,
           "ref_recon_grow_cloud_one_layer",(ulong)uVar2,"copy");
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,
                                                         REF_CLOUD *one_layer,
                                                         REF_NODE ref_node) {
  REF_CLOUD copy;
  REF_STATUS ref_status;
  REF_INT pivot_index, local_pivot;
  REF_INT add_index, i;
  REF_GLOB global, global_pivot;
  REF_DBL xyzs[4];
  RSS(ref_cloud_deep_copy(&copy, ref_cloud), "copy");
  each_ref_cloud_global(copy, pivot_index, global_pivot) {
    ref_status = ref_node_local(ref_node, global_pivot, &local_pivot);
    if (REF_NOT_FOUND == ref_status) {
      printf("global %ld not found\n", global_pivot);
      continue;
    } else {
      RSS(ref_status, "local search");
    }
    each_ref_cloud_global(one_layer[local_pivot], add_index, global) {
      each_ref_cloud_aux(one_layer[local_pivot], i) {
        xyzs[i] = ref_cloud_aux(one_layer[local_pivot], i, add_index);
      }
      RSS(ref_cloud_store(ref_cloud, global, xyzs), "store stencil increase");
    }
  }
  ref_cloud_free(copy);

  return REF_SUCCESS;
}